

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

string * __thiscall Function::Prologue::to_string_abi_cxx11_(Prologue *this,int indent)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  int in_EDX;
  byte *in_RSI;
  string *in_RDI;
  int i_1;
  int i;
  string indent_str;
  char *buff_ptr;
  char buff [512];
  undefined4 in_stack_fffffffffffffcdc;
  vector<Register,_std::allocator<Register>_> *in_stack_fffffffffffffce0;
  allocator *paVar5;
  char *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  allocator local_2a9;
  string local_2a8 [36];
  int local_284;
  string local_280 [36];
  int local_25c;
  undefined4 local_258;
  allocator local_241;
  string local_240 [32];
  char *local_220;
  char local_218 [536];
  
  local_220 = local_218;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,(long)in_EDX,' ',&local_241);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  pcVar4 = local_220;
  if ((*in_RSI & 1) == 0) {
    std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  }
  else {
    uVar3 = std::__cxx11::string::c_str();
    uVar1 = (uint)(in_RSI[0x34] & 1);
    iVar2 = sprintf(pcVar4,"%sstack: total 0x%02x, fp? %d ra? %d ep? %d",uVar3,
                    (ulong)*(uint *)(in_RSI + 4),(ulong)(in_RSI[0x18] & 1),(ulong)(in_RSI[8] & 1));
    pcVar4 = local_220 + iVar2;
    local_220 = pcVar4;
    if (*(int *)(in_RSI + 0x2c) != 0) {
      uVar3 = std::__cxx11::string::c_str();
      iVar2 = sprintf(pcVar4,"\n%sstack_vars: %d bytes at %d",uVar3,(ulong)*(uint *)(in_RSI + 0x2c),
                      (ulong)*(uint *)(in_RSI + 0x30));
      local_220 = local_220 + iVar2;
    }
    pcVar4 = local_220;
    if (*(int *)(in_RSI + 0x1c) != 0) {
      uVar3 = std::__cxx11::string::c_str();
      iVar2 = sprintf(pcVar4,"\n%sgprs:",uVar3);
      local_220 = local_220 + iVar2;
      for (local_25c = 0; local_25c < *(int *)(in_RSI + 0x1c); local_25c = local_25c + 1) {
        pcVar4 = local_220;
        in_stack_fffffffffffffd08 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::vector<Register,_std::allocator<Register>_>::at
                       (in_stack_fffffffffffffce0,CONCAT44(in_stack_fffffffffffffcdc,uVar1));
        Register::to_string_abi_cxx11_((Register *)in_stack_fffffffffffffd08);
        uVar3 = std::__cxx11::string::c_str();
        iVar2 = sprintf(pcVar4," %s",uVar3);
        local_220 = local_220 + iVar2;
        std::__cxx11::string::~string(local_280);
      }
    }
    pcVar4 = local_220;
    if (*(int *)(in_RSI + 0x24) != 0) {
      uVar3 = std::__cxx11::string::c_str();
      iVar2 = sprintf(pcVar4,"\n%sfprs:",uVar3);
      local_220 = local_220 + iVar2;
      for (local_284 = 0; pcVar4 = local_220, local_284 < *(int *)(in_RSI + 0x24);
          local_284 = local_284 + 1) {
        std::vector<Register,_std::allocator<Register>_>::at
                  (in_stack_fffffffffffffce0,CONCAT44(in_stack_fffffffffffffcdc,uVar1));
        Register::to_string_abi_cxx11_((Register *)in_stack_fffffffffffffd08);
        uVar3 = std::__cxx11::string::c_str();
        iVar2 = sprintf(pcVar4," %s",uVar3);
        local_220 = local_220 + iVar2;
        std::__cxx11::string::~string(local_2a8);
      }
    }
    paVar5 = &local_2a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,local_218,paVar5);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  }
  local_258 = 1;
  std::__cxx11::string::~string(local_240);
  return in_RDI;
}

Assistant:

std::string Function::Prologue::to_string(int indent) const {
  char buff[512];
  char* buff_ptr = buff;
  std::string indent_str(indent, ' ');
  if (!decoded) {
    return indent_str + "BAD PROLOGUE";
  }
  buff_ptr += sprintf(buff_ptr, "%sstack: total 0x%02x, fp? %d ra? %d ep? %d", indent_str.c_str(),
                      total_stack_usage, fp_set, ra_backed_up, epilogue_ok);
  if (n_stack_var_bytes) {
    buff_ptr += sprintf(buff_ptr, "\n%sstack_vars: %d bytes at %d", indent_str.c_str(),
                        n_stack_var_bytes, stack_var_offset);
  }
  if (n_gpr_backup) {
    buff_ptr += sprintf(buff_ptr, "\n%sgprs:", indent_str.c_str());
    for (int i = 0; i < n_gpr_backup; i++) {
      buff_ptr += sprintf(buff_ptr, " %s", gpr_backups.at(i).to_string().c_str());
    }
  }
  if (n_fpr_backup) {
    buff_ptr += sprintf(buff_ptr, "\n%sfprs:", indent_str.c_str());
    for (int i = 0; i < n_fpr_backup; i++) {
      buff_ptr += sprintf(buff_ptr, " %s", fpr_backups.at(i).to_string().c_str());
    }
  }
  return {buff};
}